

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::out_write(Nvim *this,string *str)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"nvim_out_write",&local_39);
  NvimRPC::call<std::__cxx11::string>(&this->client_,&local_38,(nullptr_t)0x0,str);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Nvim::out_write(const std::string& str) {
    client_.call("nvim_out_write", nullptr, str);
}